

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# firstpass.c
# Opt level: O0

void first_pass_motion_search
               (AV1_COMP *cpi,MACROBLOCK *x,MV *ref_mv,FULLPEL_MV *best_mv,int *best_motion_err)

{
  byte bVar1;
  FULLPEL_MV FVar2;
  int iVar3;
  FULLPEL_MV start_mv_00;
  uint step_param_00;
  search_site_config *ms_params_00;
  undefined4 *in_RCX;
  MV *in_RDX;
  long in_RSI;
  long *in_RDI;
  int *in_R8;
  MSBuffers *ms_buffers;
  aom_variance_fn_ptr_t v_fn_ptr;
  FULLPEL_MV_STATS best_mv_stats;
  FULLPEL_MV this_best_mv;
  FULLPEL_MOTION_SEARCH_PARAMS ms_params;
  int fine_search_interval;
  search_site_config *first_pass_search_sites;
  int step_param;
  int sr;
  int new_mv_mode_penalty;
  BLOCK_SIZE bsize;
  int tmp_err;
  FULLPEL_MV start_mv;
  MACROBLOCKD *xd;
  AV1_COMMON *cm;
  undefined8 in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe24;
  undefined4 in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe2c;
  byte local_1c9;
  buf_2d *in_stack_fffffffffffffe40;
  buf_2d *in_stack_fffffffffffffe48;
  aom_variance_fn_ptr_t *in_stack_fffffffffffffe50;
  MV_COST_PARAMS *in_stack_fffffffffffffe58;
  FULLPEL_MV in_stack_fffffffffffffe64;
  MV *in_stack_fffffffffffffe98;
  BLOCK_SIZE in_stack_fffffffffffffea7;
  MACROBLOCK *in_stack_fffffffffffffea8;
  AV1_COMP *in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffebc;
  FULLPEL_MV in_stack_fffffffffffffec4;
  search_site_config *in_stack_fffffffffffffed0;
  SEARCH_METHODS in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffee0;
  FULLPEL_MV_STATS *in_stack_ffffffffffffff88;
  FULLPEL_MV *in_stack_ffffffffffffff90;
  int *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffc0;
  
  FVar2 = get_fullmv_from_mv(in_RDX);
  bVar1 = *(byte *)**(undefined8 **)(in_RSI + 0x2058);
  iVar3 = get_search_range((int)in_RDI[0x77f7],*(int *)((long)in_RDI + 0x3bfbc));
  start_mv_00 = (FULLPEL_MV)(*(int *)((long)in_RDI + 0x608f4) + iVar3);
  ms_params_00 = av1_get_first_pass_search_site_config
                           ((AV1_COMP *)
                            CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                            (MACROBLOCK *)
                            CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                            (SEARCH_METHODS)((ulong)in_stack_fffffffffffffe18 >> 0x38));
  local_1c9 = 0;
  if (*(int *)((long)in_RDI + 0x9d2fc) != 0) {
    local_1c9 = *(byte *)(in_RDI + 0x782e);
  }
  step_param_00 = (uint)(local_1c9 & 1);
  av1_make_default_fullpel_ms_params
            ((FULLPEL_MOTION_SEARCH_PARAMS *)
             CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),in_stack_fffffffffffffeb0
             ,in_stack_fffffffffffffea8,in_stack_fffffffffffffea7,in_stack_fffffffffffffe98,
             in_stack_fffffffffffffec4,in_stack_fffffffffffffed0,in_stack_fffffffffffffed8,
             in_stack_fffffffffffffee0);
  iVar3 = av1_full_pixel_search
                    (start_mv_00,(FULLPEL_MOTION_SEARCH_PARAMS *)ms_params_00,step_param_00,
                     in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                     (FULLPEL_MV *)CONCAT44(FVar2,in_stack_ffffffffffffffc0));
  if (iVar3 < 0x7fffffff) {
    memcpy(&stack0xfffffffffffffe40,(void *)(*in_RDI + 0xc900 + (ulong)bVar1 * 0x70),0x70);
    iVar3 = av1_get_mvpred_sse(in_stack_fffffffffffffe58,in_stack_fffffffffffffe64,
                               in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
                               in_stack_fffffffffffffe40);
    iVar3 = iVar3 + 0x20;
  }
  if (iVar3 < *in_R8) {
    *in_R8 = iVar3;
    *in_RCX = in_stack_fffffffffffffebc;
  }
  return;
}

Assistant:

static inline void first_pass_motion_search(AV1_COMP *cpi, MACROBLOCK *x,
                                            const MV *ref_mv,
                                            FULLPEL_MV *best_mv,
                                            int *best_motion_err) {
  AV1_COMMON *const cm = &cpi->common;
  MACROBLOCKD *const xd = &x->e_mbd;
  FULLPEL_MV start_mv = get_fullmv_from_mv(ref_mv);
  int tmp_err;
  const BLOCK_SIZE bsize = xd->mi[0]->bsize;
  const int new_mv_mode_penalty = NEW_MV_MODE_PENALTY;
  const int sr = get_search_range(cm->width, cm->height);
  const int step_param = cpi->sf.fp_sf.reduce_mv_step_param + sr;

  const search_site_config *first_pass_search_sites =
      av1_get_first_pass_search_site_config(cpi, x, NSTEP);
  const int fine_search_interval =
      cpi->is_screen_content_type && cm->features.allow_intrabc;
  FULLPEL_MOTION_SEARCH_PARAMS ms_params;
  av1_make_default_fullpel_ms_params(&ms_params, cpi, x, bsize, ref_mv,
                                     start_mv, first_pass_search_sites, NSTEP,
                                     fine_search_interval);

  FULLPEL_MV this_best_mv;
  FULLPEL_MV_STATS best_mv_stats;
  tmp_err = av1_full_pixel_search(start_mv, &ms_params, step_param, NULL,
                                  &this_best_mv, &best_mv_stats, NULL);

  if (tmp_err < INT_MAX) {
    aom_variance_fn_ptr_t v_fn_ptr = cpi->ppi->fn_ptr[bsize];
    const MSBuffers *ms_buffers = &ms_params.ms_buffers;
    tmp_err = av1_get_mvpred_sse(&ms_params.mv_cost_params, this_best_mv,
                                 &v_fn_ptr, ms_buffers->src, ms_buffers->ref) +
              new_mv_mode_penalty;
  }

  if (tmp_err < *best_motion_err) {
    *best_motion_err = tmp_err;
    *best_mv = this_best_mv;
  }
}